

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void DefPoint(Map *maze,Point *start,Point *end)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = start->x;
  if ((int)uVar1 < maze->m) {
    uVar2 = start->y;
    if ((-1 < (int)(uVar1 | uVar2)) && ((int)uVar2 < maze->n)) {
      *(undefined4 *)
       (*(long *)&(maze->map).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl + (ulong)uVar2 * 4) = 2;
    }
  }
  uVar1 = end->x;
  if ((int)uVar1 < maze->m) {
    uVar2 = end->y;
    if ((-1 < (int)(uVar1 | uVar2)) && ((int)uVar2 < maze->n)) {
      *(undefined4 *)
       (*(long *)&(maze->map).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl + (ulong)uVar2 * 4) = 3;
    }
  }
  return;
}

Assistant:

inline bool Map::Assign(const Point& pos, int value)
{
    return Assign(pos.x, pos.y, value);
}